

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O1

void __thiscall BeliefSetNonStationary::~BeliefSetNonStationary(BeliefSetNonStationary *this)

{
  pointer pvVar1;
  pointer ppJVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((this->_m_beliefSets).
      super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_m_beliefSets).
      super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      pvVar1 = (this->_m_beliefSets).
               super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppJVar2 = *(pointer *)
                 &pvVar1[uVar5].
                  super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                  ._M_impl;
      if (*(pointer *)
           ((long)&pvVar1[uVar5].
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   ._M_impl + 8) != ppJVar2) {
        uVar3 = 0;
        uVar4 = 1;
        do {
          if (ppJVar2[uVar3] != (JointBeliefInterface *)0x0) {
            (**(code **)((long)*ppJVar2[uVar3] + 8))();
          }
          pvVar1 = (this->_m_beliefSets).
                   super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppJVar2 = *(pointer *)
                     &pvVar1[uVar5].
                      super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                      ._M_impl;
          bVar6 = (long)*(pointer *)
                         ((long)&pvVar1[uVar5].
                                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                                 ._M_impl + 8) - (long)ppJVar2 >> 3 != uVar4;
          uVar3 = uVar4;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (bVar6);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (((long)(this->_m_beliefSets).
                    super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_m_beliefSets).
                    super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar5 !=
             0);
  }
  std::
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  ::~vector(&this->_m_beliefSets);
  return;
}

Assistant:

BeliefSetNonStationary::~BeliefSetNonStationary()
{
    for(Index t=0;t!=_m_beliefSets.size();++t)
        for(Index j=0;j!=_m_beliefSets[t].size();j++)
            delete _m_beliefSets[t][j];
}